

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  ImGuiWindow *ref_window;
  bool bVar1;
  ImGuiContext *pIVar2;
  ImGuiID IVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ImGuiWindow *pIVar8;
  
  pIVar2 = GImGui;
  if (under_this_window == (ImGuiWindow *)0x0) {
    uVar4 = (GImGui->WindowsFocusOrder).Size - 1;
  }
  else {
    iVar7 = -1;
    if ((under_this_window->Flags & 0x1000000) != 0) {
      do {
        under_this_window = under_this_window->ParentWindow;
      } while ((under_this_window->Flags & 0x1000000) != 0);
      iVar7 = 0;
    }
    uVar4 = under_this_window->FocusOrder + iVar7;
  }
  if (-1 < (int)uVar4) {
    lVar5 = (ulong)uVar4 + 1;
    do {
      pIVar8 = (GImGui->WindowsFocusOrder).Data[lVar5 + -1];
      if (((pIVar8 != ignore_window) && (pIVar8->WasActive == true)) &&
         ((~pIVar8->Flags & 0x40200U) != 0)) {
        ref_window = pIVar8->NavLastChildNavWindow;
        if ((ref_window != (ImGuiWindow *)0x0) && (ref_window->WasActive != false)) {
          if (GImGui->NavWindow != ref_window) {
            GImGui->NavWindow = ref_window;
            IVar3 = 0;
            if (ref_window != (ImGuiWindow *)0x0) {
              if (pIVar2->NavDisableMouseHover == true) {
                pIVar2->NavMousePosDirty = true;
              }
              IVar3 = ref_window->NavLastIds[0];
            }
            pIVar2->NavId = IVar3;
            pIVar2->NavFocusScopeId = 0;
            pIVar2->NavIdIsAlive = false;
            pIVar2->NavLayer = ImGuiNavLayer_Main;
            pIVar2->NavMoveSubmitted = false;
            pIVar2->NavMoveScoringItems = false;
            pIVar2->NavAnyRequest = false;
            pIVar2->NavInitRequest = false;
          }
          pIVar8 = (ImGuiWindow *)0x0;
          ClosePopupsOverWindow(ref_window,false);
          if (ref_window != (ImGuiWindow *)0x0) {
            pIVar8 = ref_window->RootWindow;
          }
          if (((pIVar2->ActiveId != 0) && (pIVar2->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
             ((pIVar2->ActiveIdWindow->RootWindow != pIVar8 &&
              (pIVar2->ActiveIdNoClearOnFocusLoss == false)))) {
            SetActiveID(0,(ImGuiWindow *)0x0);
          }
          if (ref_window != (ImGuiWindow *)0x0) {
            BringWindowToFocusFront(pIVar8);
            if (((uint)(pIVar8->Flags | ref_window->Flags) >> 0xd & 1) == 0) {
              BringWindowToDisplayFront(pIVar8);
              return;
            }
          }
          return;
        }
        FocusWindow(pIVar8);
        return;
      }
      lVar6 = lVar5 + -1;
      bVar1 = 0 < lVar5;
      lVar5 = lVar6;
    } while (lVar6 != 0 && bVar1);
  }
  FocusWindow((ImGuiWindow *)0x0);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;
    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        // Aim at root window behind us, if we are in a child window that's our own root (see #4640)
        int offset = -1;
        while (under_this_window->Flags & ImGuiWindowFlags_ChildWindow)
        {
            under_this_window = under_this_window->ParentWindow;
            offset = 0;
        }
        start_idx = FindWindowFocusIndex(under_this_window) + offset;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        IM_ASSERT(window == window->RootWindow);
        if (window != ignore_window && window->WasActive)
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}